

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLExportTest_writeBoolTest_Test::~OpenDDLExportTest_writeBoolTest_Test
          (OpenDDLExportTest_writeBoolTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeBoolTest) {
    OpenDDLExportMock myExport;
    Value *v = ValueAllocator::allocPrimData(Value::ValueType::ddl_bool);
    v->setBool(true);

    std::string statement;
    bool ok(true);
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("true", statement);

    v->setBool(false);
    statement.clear();
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("false", statement);

    ValueAllocator::releasePrimData(&v);
}